

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
libcellml::Parser::ParserImpl::loadEncapsulation(ParserImpl *this,ModelPtr *model,XmlNodePtr *node)

{
  IssueImpl *pIVar1;
  bool bVar2;
  bool bVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  size_t sVar9;
  shared_ptr<libcellml::XmlNode> local_3a8;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  undefined1 local_338 [8];
  IssuePtr issue_3;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 local_268 [8];
  IssuePtr issue_2;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_198 [8];
  IssuePtr issue_1;
  shared_ptr<libcellml::XmlNode> local_180;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  IssuePtr issue;
  string textNode;
  string local_88 [7];
  bool haveComponentRef;
  string encapsulationId;
  ComponentPtr parentComponent;
  undefined1 local_48 [8];
  XmlNodePtr componentRefNode;
  NameList usedNames;
  XmlNodePtr *node_local;
  ModelPtr *model_local;
  ParserImpl *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&componentRefNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount);
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             node);
  XmlNode::firstChild((XmlNode *)local_48);
  do {
    bVar2 = std::operator!=((shared_ptr<libcellml::XmlNode> *)local_48,(nullptr_t)0x0);
    if (!bVar2) {
      std::shared_ptr<libcellml::XmlNode>::~shared_ptr((shared_ptr<libcellml::XmlNode> *)local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&componentRefNode.
                    super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    std::shared_ptr<libcellml::Component>::shared_ptr
              ((shared_ptr<libcellml::Component> *)((long)&encapsulationId.field_2 + 8),
               (nullptr_t)0x0);
    std::__cxx11::string::string(local_88);
    bVar2 = false;
    bVar3 = parseNode(this,(XmlNodePtr *)local_48,"component_ref");
    if (bVar3) {
      bVar2 = true;
      loadComponentRef((ParserImpl *)((long)&textNode.field_2 + 8),(ModelPtr *)this,
                       (XmlNodePtr *)model,(NameList *)local_48);
      std::shared_ptr<libcellml::Component>::operator=
                ((shared_ptr<libcellml::Component> *)((long)&encapsulationId.field_2 + 8),
                 (shared_ptr<libcellml::Component> *)((long)&textNode.field_2 + 8));
      std::shared_ptr<libcellml::Component>::~shared_ptr
                ((shared_ptr<libcellml::Component> *)((long)&textNode.field_2 + 8));
LAB_003310c5:
      bVar3 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)(encapsulationId.field_2._M_local_buf + 8));
      if (bVar3) {
        peVar6 = std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)model);
        ComponentEntity::addComponent
                  (&peVar6->super_ComponentEntity,
                   (ComponentPtr *)((long)&encapsulationId.field_2 + 8));
        peVar8 = std::
                 __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(encapsulationId.field_2._M_local_buf + 8));
        sVar9 = ComponentEntity::componentCount(&peVar8->super_ComponentEntity);
        if (sVar9 == 0) {
          Issue::IssueImpl::create();
          peVar5 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_268);
          pIVar1 = peVar5->mPimpl;
          peVar6 = std::
                   __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)model);
          NamedEntity::name_abi_cxx11_(&local_308,(NamedEntity *)peVar6);
          std::operator+(&local_2e8,"Encapsulation in model \'",&local_308);
          std::operator+(&local_2c8,&local_2e8,"\' specifies \'");
          peVar8 = std::
                   __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(encapsulationId.field_2._M_local_buf + 8));
          NamedEntity::name_abi_cxx11_
                    ((string *)
                     &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(NamedEntity *)peVar8);
          std::operator+(&local_2a8,&local_2c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
          std::operator+(&local_288,&local_2a8,
                         "\' as a parent component_ref but it does not have any children.");
          Issue::IssueImpl::setDescription(pIVar1,&local_288);
          std::__cxx11::string::~string((string *)&local_288);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string
                    ((string *)
                     &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::__cxx11::string::~string((string *)&local_308);
          peVar5 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_268);
          peVar7 = std::
                   __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar5->mPimpl->mItem);
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation(peVar7->mPimpl,model);
          peVar5 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_268);
          Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,ENCAPSULATION_CHILD);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_268);
          std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_268);
        }
      }
      else if (bVar2) {
        Issue::IssueImpl::create();
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_338);
        pIVar1 = peVar5->mPimpl;
        peVar6 = std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)model);
        NamedEntity::name_abi_cxx11_(&local_398,(NamedEntity *)peVar6);
        std::operator+(&local_378,"Encapsulation in model \'",&local_398);
        std::operator+(&local_358,&local_378,
                       "\' specifies an invalid parent component_ref that also does not have any children."
                      );
        Issue::IssueImpl::setDescription(pIVar1,&local_358);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::string::~string((string *)&local_398);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_338);
        peVar7 = std::
                 __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar5->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation(peVar7->mPimpl,model);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_338);
        Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,ENCAPSULATION_CHILD);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_338);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_338);
      }
      std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_48);
      XmlNode::next((XmlNode *)&local_3a8);
      std::shared_ptr<libcellml::XmlNode>::operator=
                ((shared_ptr<libcellml::XmlNode> *)local_48,&local_3a8);
      std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_3a8);
      issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = 0;
    }
    else {
      peVar4 = std::
               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
      bVar3 = XmlNode::isText(peVar4);
      if (!bVar3) {
        peVar4 = std::
                 __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
        bVar3 = XmlNode::isComment(peVar4);
        if (!bVar3) {
          if ((this->mParsing1XVersion & 1U) != 0) {
            peVar4 = std::
                     __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_48);
            bVar3 = XmlNode::isCellml1XElement(peVar4,"relationship_ref");
            if (bVar3) goto LAB_003310c5;
          }
          Issue::IssueImpl::create();
          peVar5 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_198);
          pIVar1 = peVar5->mPimpl;
          peVar6 = std::
                   __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)model);
          NamedEntity::name_abi_cxx11_(&local_238,(NamedEntity *)peVar6);
          std::operator+(&local_218,"Encapsulation in model \'",&local_238);
          std::operator+(&local_1f8,&local_218,"\' has an invalid child element \'");
          peVar4 = std::
                   __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_48);
          XmlNode::name_abi_cxx11_
                    ((string *)
                     &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,peVar4);
          std::operator+(&local_1d8,&local_1f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
          std::operator+(&local_1b8,&local_1d8,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&local_1b8);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string
                    ((string *)
                     &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_238);
          peVar5 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_198);
          peVar7 = std::
                   __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar5->mPimpl->mItem);
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation(peVar7->mPimpl,model);
          peVar5 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_198);
          Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,ENCAPSULATION_CHILD);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_198);
          std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_198);
        }
        goto LAB_003310c5;
      }
      peVar4 = std::
               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
      XmlNode::convertToString_abi_cxx11_
                ((string *)
                 &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,peVar4);
      bVar3 = hasNonWhitespaceCharacters
                        ((string *)
                         &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (bVar3) {
        Issue::IssueImpl::create();
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_d0);
        pIVar1 = peVar5->mPimpl;
        peVar6 = std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)model);
        NamedEntity::name_abi_cxx11_(&local_170,(NamedEntity *)peVar6);
        std::operator+(&local_150,"Encapsulation in model \'",&local_170);
        std::operator+(&local_130,&local_150,
                       "\' has an invalid non-whitespace child text element \'");
        std::operator+(&local_110,&local_130,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
        std::operator+(&local_f0,&local_110,"\'.");
        Issue::IssueImpl::setDescription(pIVar1,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_d0);
        peVar7 = std::
                 __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar5->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation(peVar7->mPimpl,model);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_d0);
        Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,XML_UNEXPECTED_CHARACTER);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_d0);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_d0);
        issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = 0;
      }
      else {
        std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_48);
        XmlNode::next((XmlNode *)&local_180);
        std::shared_ptr<libcellml::XmlNode>::operator=
                  ((shared_ptr<libcellml::XmlNode> *)local_48,&local_180);
        std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_180);
        issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = 2;
      }
      std::__cxx11::string::~string
                ((string *)
                 &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      if (issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ._4_4_ == 0) goto LAB_003310c5;
    }
    std::__cxx11::string::~string(local_88);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)((long)&encapsulationId.field_2 + 8));
  } while( true );
}

Assistant:

void Parser::ParserImpl::loadEncapsulation(const ModelPtr &model, const XmlNodePtr &node)
{
    NameList usedNames;
    XmlNodePtr componentRefNode = node->firstChild();
    while (componentRefNode != nullptr) {
        ComponentPtr parentComponent = nullptr;
        std::string encapsulationId;
        bool haveComponentRef = false;
        if (parseNode(componentRefNode, "component_ref")) {
            haveComponentRef = true;
            parentComponent = loadComponentRef(model, componentRefNode, usedNames);
        } else if (componentRefNode->isText()) {
            const std::string textNode = componentRefNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            } else {
                // Continue to next node if this is whitespace (don't try to parse children of whitespace).
                componentRefNode = componentRefNode->next();
                continue;
            }
        } else if (componentRefNode->isComment()) {
            // Do nothing.
        } else if (mParsing1XVersion && componentRefNode->isCellml1XElement("relationship_ref")) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid child element '" + componentRefNode->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ENCAPSULATION_CHILD);
            addIssue(issue);
        }

        // Add the parentComponent to the model with its child(ren) encapsulated.
        if (parentComponent) {
            model->addComponent(parentComponent);
            if (parentComponent->componentCount() == 0) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' specifies '" + parentComponent->name() + "' as a parent component_ref but it does not have any children.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ENCAPSULATION_CHILD);
                addIssue(issue);
            }
        } else if (haveComponentRef) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' specifies an invalid parent component_ref that also does not have any children.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ENCAPSULATION_CHILD);
            addIssue(issue);
        }

        componentRefNode = componentRefNode->next();
    }
}